

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::computeVertexPrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  Edge e;
  Edge e_00;
  Halfedge e_01;
  bool bVar1;
  double *pdVar2;
  Vector2 *pVVar3;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *in_RDI;
  Vector2 VVar4;
  Vector2 vec;
  double alpha;
  double len;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> *__range3;
  Vector2 principalDir;
  Vertex v;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  VertexSet *__range2;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2> *in_stack_fffffffffffffe08;
  SurfaceMesh *in_stack_fffffffffffffe10;
  ParentMeshT *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe38 [16];
  Vector2 local_1b8;
  Vector2 local_1a8;
  Vector2 local_198;
  Vector2 local_188;
  ParentMeshT *local_178;
  size_t local_170;
  Vector2 local_168;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_158;
  double local_148;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_140;
  double local_130;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_128;
  NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> local_118 [2];
  NavigationSetBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> local_e8;
  NavigationSetBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> *local_c0;
  Vector2 local_b8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_a8;
  undefined1 local_68 [24];
  undefined1 *local_50;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffe10);
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffe10);
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffe10);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::MeshData
            (in_stack_fffffffffffffe38._8_8_,in_stack_fffffffffffffe38._0_8_);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::operator=
            ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2> *)
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::~MeshData
            ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2> *)
             in_stack_fffffffffffffe10);
  SurfaceMesh::vertices(in_stack_fffffffffffffe10);
  local_50 = local_68;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_fffffffffffffe10);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_fffffffffffffe10);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_fffffffffffffe10,
                       (RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_fffffffffffffe08);
    if (!bVar1) break;
    local_a8 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)0x3a23d1);
    memset(&local_b8,0,0x10);
    Vertex::outgoingHalfedges((Vertex *)in_RDI);
    local_c0 = &local_e8;
    NavigationSetBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>::begin
              ((NavigationSetBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> *)
               in_RDI);
    NavigationSetBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>::end
              (local_118,local_c0);
    while( true ) {
      bVar1 = NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>::
              operator!=((NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>
                          *)in_stack_fffffffffffffe10,
                         (NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>
                          *)in_stack_fffffffffffffe08);
      if (!bVar1) break;
      local_128 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>
                    ::operator*((NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>
                                 *)0x3a246f);
      in_stack_fffffffffffffe10 = (SurfaceMesh *)&in_RDI[0xd].permuteCallbackIt;
      local_140 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::edge((Halfedge *)in_stack_fffffffffffffe10);
      e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           in_stack_fffffffffffffe30;
      e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           in_stack_fffffffffffffe28;
      pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Edge,_double> *)in_RDI,e);
      local_130 = *pdVar2;
      local_158 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::edge((Halfedge *)in_stack_fffffffffffffe10);
      e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
           = in_stack_fffffffffffffe30;
      e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_stack_fffffffffffffe28;
      pdVar2 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Edge,_double> *)in_RDI,e_00);
      local_148 = *pdVar2;
      local_178 = local_128.mesh;
      local_170 = local_128.ind;
      e_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      ind = in_stack_fffffffffffffe30;
      e_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffe28;
      pVVar3 = MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator[]
                         (in_RDI,e_01);
      local_168.x = pVVar3->x;
      local_168.y = pVVar3->y;
      local_1b8 = Vector2::operator-(&local_168);
      local_1a8 = Vector2::operator*(&local_1b8,&local_168);
      local_198 = Vector2::operator/(&local_1a8,local_130);
      local_188 = Vector2::operator*(&local_198,local_148);
      Vector2::operator+=(&local_b8,&local_188);
      NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>::operator++
                ((NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>
                  *)in_stack_fffffffffffffe10);
    }
    VVar4 = Vector2::operator/(&local_b8,4.0);
    in_stack_fffffffffffffe28 = local_a8.mesh;
    in_stack_fffffffffffffe30 = local_a8.ind;
    pVVar3 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::operator[]
                       ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2> *)
                        in_RDI,(Vertex)local_a8);
    pVVar3->x = VVar4.x;
    pVVar3->y = VVar4.y;
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
               in_stack_fffffffffffffe10);
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::computeVertexPrincipalCurvatureDirections() {
  edgeLengthsQ.ensureHave();
  halfedgeVectorsInVertexQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  vertexPrincipalCurvatureDirections = VertexData<Vector2>(mesh);

  for (Vertex v : mesh.vertices()) {
    Vector2 principalDir{0.0, 0.0};
    for (Halfedge he : v.outgoingHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      Vector2 vec = halfedgeVectorsInVertex[he];
      principalDir += -vec * vec / len * alpha;
    }

    vertexPrincipalCurvatureDirections[v] = principalDir / 4;
  }
}